

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_stats.cpp
# Opt level: O2

FilterPropagateResult
duckdb::CheckZonemapTemplated<float>
          (BaseStatistics *stats,ExpressionType comparison_type,float min_value,float max_value,
          float constant)

{
  bool bVar1;
  InternalException *this;
  undefined7 in_register_00000031;
  float *right;
  float *left;
  float constant_local;
  float max_value_local;
  float min_value_local;
  float local_48;
  float local_44;
  float local_40;
  allocator local_39;
  string local_38;
  
  constant_local = constant;
  max_value_local = max_value;
  min_value_local = min_value;
  local_48 = min_value;
  local_44 = max_value;
  local_40 = constant;
  switch((int)CONCAT71(in_register_00000031,comparison_type)) {
  case 0x19:
  case 0x28:
    bVar1 = ConstantExactRange<float>(min_value,max_value,constant);
    if (bVar1) {
      return FILTER_ALWAYS_TRUE;
    }
    bVar1 = ConstantValueInRange<float>(min_value_local,max_value_local,constant_local);
    break;
  case 0x1a:
  case 0x25:
    bVar1 = ConstantValueInRange<float>(min_value,max_value,constant);
    if (!bVar1) {
      return FILTER_ALWAYS_TRUE;
    }
    bVar1 = ConstantExactRange<float>(min_value_local,max_value_local,constant_local);
    goto LAB_0153cb9e;
  case 0x1b:
    bVar1 = GreaterThan::Operation<float>(&constant_local,&max_value_local);
    if (bVar1) {
      return FILTER_ALWAYS_TRUE;
    }
    left = &constant_local;
    right = &min_value_local;
    goto LAB_0153cb47;
  case 0x1c:
    bVar1 = GreaterThan::Operation<float>(&min_value_local,&constant_local);
    if (bVar1) {
      return FILTER_ALWAYS_TRUE;
    }
    left = &max_value_local;
    right = &constant_local;
LAB_0153cb47:
    bVar1 = GreaterThan::Operation<float>(left,right);
    break;
  case 0x1d:
    bVar1 = LessThanEquals::Operation<float>(&max_value_local,&constant_local);
    if (bVar1) {
      return FILTER_ALWAYS_TRUE;
    }
    bVar1 = LessThanEquals::Operation<float>(&min_value_local,&constant_local);
    break;
  case 0x1e:
    bVar1 = GreaterThanEquals::Operation<float>(&min_value_local,&constant_local);
    if (bVar1) {
      return FILTER_ALWAYS_TRUE;
    }
    bVar1 = GreaterThanEquals::Operation<float>(&max_value_local,&constant_local);
    break;
  default:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_38,"Expression type in zonemap check not implemented",&local_39);
    InternalException::InternalException(this,&local_38);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  bVar1 = (bool)(bVar1 ^ 1);
LAB_0153cb9e:
  return bVar1 * '\x02';
}

Assistant:

FilterPropagateResult CheckZonemapTemplated(const BaseStatistics &stats, ExpressionType comparison_type, T min_value,
                                            T max_value, T constant) {
	switch (comparison_type) {
	case ExpressionType::COMPARE_EQUAL:
	case ExpressionType::COMPARE_NOT_DISTINCT_FROM:
		if (ConstantExactRange(min_value, max_value, constant)) {
			return FilterPropagateResult::FILTER_ALWAYS_TRUE;
		}
		if (ConstantValueInRange(min_value, max_value, constant)) {
			return FilterPropagateResult::NO_PRUNING_POSSIBLE;
		}
		return FilterPropagateResult::FILTER_ALWAYS_FALSE;
	case ExpressionType::COMPARE_NOTEQUAL:
	case ExpressionType::COMPARE_DISTINCT_FROM:
		if (!ConstantValueInRange(min_value, max_value, constant)) {
			return FilterPropagateResult::FILTER_ALWAYS_TRUE;
		} else if (ConstantExactRange(min_value, max_value, constant)) {
			// corner case of a cluster with one numeric equal to the target constant
			return FilterPropagateResult::FILTER_ALWAYS_FALSE;
		}
		return FilterPropagateResult::NO_PRUNING_POSSIBLE;
	case ExpressionType::COMPARE_GREATERTHANOREQUALTO:
		// GreaterThanEquals::Operation(X, C)
		// this can be true only if max(X) >= C
		// if min(X) >= C, then this is always true
		if (GreaterThanEquals::Operation(min_value, constant)) {
			return FilterPropagateResult::FILTER_ALWAYS_TRUE;
		} else if (GreaterThanEquals::Operation(max_value, constant)) {
			return FilterPropagateResult::NO_PRUNING_POSSIBLE;
		} else {
			return FilterPropagateResult::FILTER_ALWAYS_FALSE;
		}
	case ExpressionType::COMPARE_GREATERTHAN:
		// GreaterThan::Operation(X, C)
		// this can be true only if max(X) > C
		// if min(X) > C, then this is always true
		if (GreaterThan::Operation(min_value, constant)) {
			return FilterPropagateResult::FILTER_ALWAYS_TRUE;
		} else if (GreaterThan::Operation(max_value, constant)) {
			return FilterPropagateResult::NO_PRUNING_POSSIBLE;
		} else {
			return FilterPropagateResult::FILTER_ALWAYS_FALSE;
		}
	case ExpressionType::COMPARE_LESSTHANOREQUALTO:
		// LessThanEquals::Operation(X, C)
		// this can be true only if min(X) <= C
		// if max(X) <= C, then this is always true
		if (LessThanEquals::Operation(max_value, constant)) {
			return FilterPropagateResult::FILTER_ALWAYS_TRUE;
		} else if (LessThanEquals::Operation(min_value, constant)) {
			return FilterPropagateResult::NO_PRUNING_POSSIBLE;
		} else {
			return FilterPropagateResult::FILTER_ALWAYS_FALSE;
		}
	case ExpressionType::COMPARE_LESSTHAN:
		// LessThan::Operation(X, C)
		// this can be true only if min(X) < C
		// if max(X) < C, then this is always true
		if (LessThan::Operation(max_value, constant)) {
			return FilterPropagateResult::FILTER_ALWAYS_TRUE;
		} else if (LessThan::Operation(min_value, constant)) {
			return FilterPropagateResult::NO_PRUNING_POSSIBLE;
		} else {
			return FilterPropagateResult::FILTER_ALWAYS_FALSE;
		}
	default:
		throw InternalException("Expression type in zonemap check not implemented");
	}
}